

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PathSuffixSyntax::isKind(SyntaxKind kind)

{
  return (kind - EdgeSensitivePathSuffix & 0xfffffeff) == 0;
}

Assistant:

bool PathSuffixSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EdgeSensitivePathSuffix:
        case SyntaxKind::SimplePathSuffix:
            return true;
        default:
            return false;
    }
}